

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETALAT::GetLazyPreds
          (EnvironmentNAVXYTHETALAT *this,int TargetStateID,
          vector<int,_std::allocator<int>_> *PredIDV,vector<int,_std::allocator<int>_> *CostV,
          vector<bool,_std::allocator<bool>_> *isTrueCost)

{
  char cVar1;
  EnvNAVXYTHETALATHashEntry_t *pEVar2;
  pointer piVar3;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *pvVar4;
  pointer ppEVar5;
  EnvNAVXYTHETALATAction_t *pEVar6;
  iterator iVar7;
  int iVar8;
  int *__args;
  code *pcVar9;
  uint uVar10;
  uint uVar11;
  long *plVar12;
  ulong uVar13;
  uint local_5c;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,std::allocator<int>> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  EnvNAVXYTHETALATHashEntry_t *local_40;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *local_38;
  
  pEVar2 = (this->StateID2CoordTable).
           super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
           ._M_impl.super__Vector_impl_data._M_start[TargetStateID];
  piVar3 = (PredIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((PredIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (PredIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  piVar3 = (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar3;
  }
  pvVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
  local_50 = (vector<int,std::allocator<int>> *)PredIDV;
  local_48 = isTrueCost;
  std::vector<int,_std::allocator<int>_>::reserve
            (PredIDV,(long)pvVar4[(uint)(int)pEVar2->Theta].
                           super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)pvVar4[(uint)(int)pEVar2->Theta].
                           super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
  local_58 = CostV;
  std::vector<int,_std::allocator<int>_>::reserve
            (CostV,(long)pvVar4[(uint)(int)pEVar2->Theta].
                         super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pvVar4[(uint)(int)pEVar2->Theta].
                         super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_38 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
  uVar10 = (uint)pEVar2->Theta;
  if (0 < (int)((ulong)((long)local_38[uVar10].
                              super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38[uVar10].
                             super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    local_38 = local_38 + uVar10;
    uVar13 = 0;
    local_40 = pEVar2;
    do {
      ppEVar5 = (local_38->
                super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_38->
                        super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3) <= uVar13)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar13);
      }
      pEVar6 = ppEVar5[uVar13];
      uVar11 = local_40->X - (int)pEVar6->dX;
      uVar10 = local_40->Y - (int)pEVar6->dY;
      cVar1 = pEVar6->starttheta;
      iVar8 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x41])(this,(ulong)uVar11,(ulong)uVar10);
      if ((char)iVar8 != '\0') {
        pcVar9 = (code *)this->GetHashEntry;
        plVar12 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                          *(long *)&this->field_0x1c8);
        if (((ulong)pcVar9 & 1) != 0) {
          pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
        }
        __args = (int *)(*pcVar9)(plVar12,uVar11,uVar10,(int)cVar1);
        if (__args == (int *)0x0) {
          pcVar9 = (code *)this->CreateNewHashEntry;
          plVar12 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                    super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                            *(long *)&this->field_0x1d8);
          if (((ulong)pcVar9 & 1) != 0) {
            pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
          }
          __args = (int *)(*pcVar9)(plVar12,uVar11,uVar10,(int)cVar1);
        }
        iVar7._M_current = *(int **)(local_50 + 8);
        if (iVar7._M_current == *(int **)(local_50 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_50,iVar7,__args)
          ;
        }
        else {
          *iVar7._M_current = *__args;
          *(int **)(local_50 + 8) = iVar7._M_current + 1;
        }
        local_5c = pEVar6->cost;
        iVar7._M_current =
             (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_58,iVar7,(int *)&local_5c);
        }
        else {
          *iVar7._M_current = local_5c;
          (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar7._M_current + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(local_48,false);
      }
      pvVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 <
             (long)(int)((ulong)((long)pvVar4[(uint)(int)local_40->Theta].
                                       super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)pvVar4[(uint)(int)local_40->Theta].
                                      super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetLazyPreds(
    int TargetStateID,
    std::vector<int>* PredIDV,
    std::vector<int>* CostV,
    std::vector<bool>* isTrueCost)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    // get X, Y for the state
    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[TargetStateID];

    // clear the successor array
    PredIDV->clear();
    CostV->clear();
    PredIDV->reserve(EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size());
    CostV->reserve(EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size());

    // iterate through actions
    std::vector<EnvNAVXYTHETALATAction_t*>* actionsV = &EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta];
    for (aind = 0; aind < (int)EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size(); aind++)
    {
        EnvNAVXYTHETALATAction_t* nav3daction = actionsV->at(aind);

        int predX = HashEntry->X - nav3daction->dX;
        int predY = HashEntry->Y - nav3daction->dY;
        int predTheta = nav3daction->starttheta;

        //skip the invalid cells
        if (!IsValidCell(predX, predY)) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
        if ((OutHashEntry = (this->*GetHashEntry)(predX, predY, predTheta)) == NULL) {
            OutHashEntry = (this->*CreateNewHashEntry)(predX, predY, predTheta);
        }

        PredIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(nav3daction->cost);
        isTrueCost->push_back(false);
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}